

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O1

uint32_t longest_match_slow_c(deflate_state *s,Pos cur_match)

{
  uchar *puVar1;
  ushort uVar2;
  uint uVar3;
  uchar *puVar4;
  Pos *pPVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  ulong *puVar14;
  uint uVar15;
  uint32_t len;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  ulong *puVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  uchar *puVar27;
  uint local_cc;
  uint local_c0;
  uint local_a0;
  uchar *local_88;
  uint local_7c;
  uchar *local_78;
  ulong local_38;
  
  uVar18 = (ulong)cur_match;
  uVar13 = s->strstart;
  uVar3 = s->w_mask;
  puVar4 = s->window;
  puVar1 = puVar4 + uVar13;
  local_a0 = 2;
  if (s->prev_length != 0) {
    local_a0 = s->prev_length;
  }
  uVar15 = 0xffffffff;
  if (3 < local_a0) {
    uVar15 = (uint)(local_a0 < 8) << 2 | 0xfffffff9;
  }
  uVar21 = *(ulong *)(puVar1 + (uVar15 + local_a0));
  local_78 = puVar4 + (uVar15 + local_a0);
  uVar15 = s->lookahead;
  uVar24 = s->max_chain_length >> 2;
  if (local_a0 < s->good_match) {
    uVar24 = s->max_chain_length;
  }
  uVar10 = s->w_size - 0x106;
  uVar23 = 0;
  uVar22 = uVar13 - uVar10;
  if (uVar13 < uVar10 || uVar22 == 0) {
    uVar22 = 0;
  }
  pPVar5 = s->prev;
  lVar6 = *(long *)(puVar4 + uVar13);
  uVar10 = s->nice_match;
  local_cc = uVar22;
  local_88 = puVar4;
  if (2 < local_a0) {
    uVar23 = 0;
    uVar11 = (*s->update_hash)(0,(uint)puVar1[1]);
    uVar11 = (*s->update_hash)(uVar11,(uint)puVar1[2]);
    uVar26 = 3;
    do {
      uVar11 = (*s->update_hash)(uVar11,(uint)puVar1[uVar26]);
      if (s->head[uVar11] < (ushort)uVar18) {
        uVar23 = (ulong)((int)uVar26 - 2);
        uVar18 = (ulong)s->head[uVar11];
      }
      uVar25 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar25;
    } while (uVar25 <= local_a0);
    local_cc = (int)uVar23 + uVar22;
    if ((ushort)uVar18 <= (ushort)local_cc) goto LAB_0010523c;
    local_78 = local_78 + -(uVar23 & 0xffff);
    local_88 = puVar4 + -(uVar23 & 0xffff);
  }
  local_7c = (uint)(uVar21 >> 0x10) & 0xffff;
  local_38 = uVar21 >> 0x20;
  do {
    if (uVar13 <= ((uint)uVar18 & 0xffff)) {
      return local_a0;
    }
    if (local_a0 < 4) {
      while ((uVar26 = uVar18 & 0xffff, *(short *)(local_78 + uVar26) != (short)uVar21 ||
             (*(short *)(local_88 + uVar26) != (short)lVar6))) {
        if (uVar24 == 1) {
          return local_a0;
        }
        uVar18 = (ulong)pPVar5[(uint)uVar26 & uVar3];
        uVar24 = uVar24 - 1;
        if (pPVar5[(uint)uVar26 & uVar3] <= (ushort)local_cc) {
          return local_a0;
        }
      }
    }
    else if (local_a0 < 8) {
      while ((uVar26 = uVar18 & 0xffff,
             *(uint *)(local_78 + uVar26) != (local_7c << 0x10 | (uint)(uVar21 & 0xffff)) ||
             (*(int *)(local_88 + uVar26) != (int)lVar6))) {
        if (uVar24 == 1) {
          return local_a0;
        }
        uVar18 = (ulong)pPVar5[(uint)uVar26 & uVar3];
        uVar24 = uVar24 - 1;
        if (pPVar5[(uint)uVar26 & uVar3] <= (ushort)local_cc) {
          return local_a0;
        }
      }
    }
    else {
      while ((uVar26 = uVar18 & 0xffff,
             *(ulong *)(local_78 + uVar26) !=
             (local_38 << 0x20 | uVar21 & 0xffff | (ulong)(local_7c << 0x10)) ||
             (*(long *)(local_88 + uVar26) != lVar6))) {
        if (uVar24 == 1) {
          return local_a0;
        }
        uVar18 = (ulong)pPVar5[(uint)uVar26 & uVar3];
        uVar24 = uVar24 - 1;
        if (pPVar5[(uint)uVar26 & uVar3] <= (ushort)local_cc) {
          return local_a0;
        }
      }
    }
    puVar14 = (ulong *)(local_88 + (uVar18 & 0xffff) + 2);
    uVar25 = 0;
    puVar20 = (ulong *)(puVar1 + 2);
    puVar27 = puVar1;
    do {
      uVar26 = *puVar20;
      uVar7 = *puVar14;
      if (uVar26 == uVar7) {
        puVar20 = puVar20 + 1;
        puVar14 = puVar14 + 1;
        uVar25 = uVar25 + 8;
      }
      else {
        uVar8 = 0;
        if ((uVar7 ^ uVar26) != 0) {
          for (; ((uVar7 ^ uVar26) >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        puVar27 = (uchar *)(ulong)(((uint)(uVar8 >> 3) & 0x1fffffff) + uVar25);
      }
      iVar17 = (int)puVar27;
      if (uVar26 != uVar7) goto LAB_00104f49;
    } while (uVar25 < 0x100);
    iVar17 = 0x100;
LAB_00104f49:
    uVar25 = iVar17 + 2;
    if (local_a0 < uVar25) {
      uVar16 = (int)(uVar18 & 0xffff) - ((uint)uVar23 & 0xffff);
      s->match_start = uVar16;
      uVar12 = uVar15;
      if ((uVar15 < uVar25) || (uVar12 = uVar25, local_a0 = uVar25, uVar10 <= uVar25)) {
        bVar9 = false;
        iVar17 = 1;
        local_c0 = uVar12;
      }
      else {
        uVar12 = iVar17 - 5;
        if (uVar25 < 8) {
          uVar12 = iVar17 - 1U;
        }
        if (uVar25 < 4) {
          uVar12 = iVar17 + 1;
        }
        uVar21 = *(ulong *)(puVar1 + uVar12);
        local_7c = (uint)(uVar21 >> 0x10) & 0xffff;
        local_38 = uVar21 >> 0x20;
        if ((uVar25 < 4) || (uVar13 <= uVar25 + uVar16)) {
          local_78 = local_88 + uVar12;
          iVar17 = 0;
          bVar9 = true;
        }
        else {
          uVar19 = 0;
          uVar23 = 0;
          uVar18 = (ulong)uVar16;
          do {
            uVar2 = pPVar5[(uVar16 & 0xffff) + uVar19 & uVar3];
            if (uVar2 < (ushort)uVar18) {
              if ((uint)uVar2 <= (uVar22 & 0xffff) + uVar19) {
                iVar17 = 5;
                uVar18 = (ulong)uVar16;
                goto LAB_00105219;
              }
              uVar23 = (ulong)uVar19;
              uVar18 = (ulong)uVar2;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 <= iVar17 - 1U);
          uVar11 = (*s->update_hash)(0,(uint)puVar1[(ulong)uVar25 - 4]);
          uVar11 = (*s->update_hash)(uVar11,(uint)puVar1[(ulong)uVar25 - 3]);
          uVar11 = (*s->update_hash)(uVar11,(uint)puVar1[(ulong)uVar25 - 2]);
          uVar2 = s->head[uVar11];
          if (uVar2 < (ushort)uVar18) {
            uVar23 = (ulong)(iVar17 - 2U);
            if ((iVar17 - 2U & 0xffff) + (uVar22 & 0xffff) < (uint)uVar2) {
              uVar18 = (ulong)uVar2;
              goto LAB_0010518d;
            }
            iVar17 = 5;
          }
          else {
LAB_0010518d:
            local_cc = (int)uVar23 + uVar22;
            local_88 = puVar4 + -(uVar23 & 0xffff);
            local_78 = local_88 + uVar12;
            iVar17 = 7;
          }
LAB_00105219:
          bVar9 = false;
        }
      }
      uVar25 = local_c0;
      if (bVar9) goto LAB_00105047;
    }
    else {
LAB_00105047:
      uVar24 = uVar24 - 1;
      if (uVar24 == 0) {
        iVar17 = 1;
        uVar25 = local_a0;
      }
      else {
        uVar12 = (uint)uVar18;
        uVar18 = (ulong)pPVar5[uVar12 & 0xffff & uVar3];
        iVar17 = 1;
        uVar25 = local_a0;
        if ((ushort)local_cc < pPVar5[uVar12 & 0xffff & uVar3]) {
          iVar17 = 7;
          uVar25 = local_c0;
        }
      }
    }
    local_c0 = uVar25;
  } while (iVar17 == 7);
  if (iVar17 != 5) {
    return local_c0;
  }
LAB_0010523c:
  uVar13 = s->lookahead;
  if (local_a0 < s->lookahead) {
    uVar13 = local_a0;
  }
  return uVar13;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}